

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeIncrPopulate(IncrMerger *pIncr)

{
  int nData;
  i64 iStart_00;
  sqlite3_io_methods *psVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  i64 iEof;
  int nKey;
  PmaReader *pReader;
  undefined1 local_68 [4];
  int dummy;
  PmaWriter writer;
  MergeEngine *pMerger;
  SortSubtask *pTask;
  SorterFile *pOut;
  i64 iStart;
  int rc2;
  int rc;
  IncrMerger *pIncr_local;
  
  iStart._4_4_ = 0;
  iStart_00 = pIncr->iStartOff;
  writer.pFd = (sqlite3_file *)pIncr->pMerger;
  vdbePmaWriterInit(pIncr->aFile[1].pFd,(PmaWriter *)local_68,pIncr->pTask->pSorter->pgsz,iStart_00)
  ;
  while (iStart._4_4_ == 0) {
    psVar1 = writer.pFd[3].pMethods;
    iVar3 = *(int *)&(writer.pFd[2].pMethods)->field_0x4;
    nData = *(int *)((long)&psVar1->xRead + (long)iVar3 * 0x50 + 4);
    lVar4 = writer._24_8_ + (long)writer.nBuffer;
    if (((&psVar1->xWrite)[(long)iVar3 * 10] ==
         (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0) ||
       (iVar2 = sqlite3VarintLen((long)nData), iStart_00 + pIncr->mxSz < lVar4 + nData + (long)iVar2
       )) break;
    vdbePmaWriteVarint((PmaWriter *)local_68,(long)nData);
    vdbePmaWriteBlob((PmaWriter *)local_68,(u8 *)(&psVar1->xSync)[(long)iVar3 * 10],nData);
    iStart._4_4_ = vdbeMergeEngineStep(pIncr->pMerger,(int *)((long)&pReader + 4));
  }
  iVar3 = vdbePmaWriterFinish((PmaWriter *)local_68,&pIncr->aFile[1].iEof);
  if (iStart._4_4_ == 0) {
    iStart._4_4_ = iVar3;
  }
  return iStart._4_4_;
}

Assistant:

static int vdbeIncrPopulate(IncrMerger *pIncr){
  int rc = SQLITE_OK;
  int rc2;
  i64 iStart = pIncr->iStartOff;
  SorterFile *pOut = &pIncr->aFile[1];
  SortSubtask *pTask = pIncr->pTask;
  MergeEngine *pMerger = pIncr->pMerger;
  PmaWriter writer;
  assert( pIncr->bEof==0 );

  vdbeSorterPopulateDebug(pTask, "enter");

  vdbePmaWriterInit(pOut->pFd, &writer, pTask->pSorter->pgsz, iStart);
  while( rc==SQLITE_OK ){
    int dummy;
    PmaReader *pReader = &pMerger->aReadr[ pMerger->aTree[1] ];
    int nKey = pReader->nKey;
    i64 iEof = writer.iWriteOff + writer.iBufEnd;

    /* Check if the output file is full or if the input has been exhausted.
    ** In either case exit the loop. */
    if( pReader->pFd==0 ) break;
    if( (iEof + nKey + sqlite3VarintLen(nKey))>(iStart + pIncr->mxSz) ) break;

    /* Write the next key to the output. */
    vdbePmaWriteVarint(&writer, nKey);
    vdbePmaWriteBlob(&writer, pReader->aKey, nKey);
    assert( pIncr->pMerger->pTask==pTask );
    rc = vdbeMergeEngineStep(pIncr->pMerger, &dummy);
  }

  rc2 = vdbePmaWriterFinish(&writer, &pOut->iEof);
  if( rc==SQLITE_OK ) rc = rc2;
  vdbeSorterPopulateDebug(pTask, "exit");
  return rc;
}